

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_d3d56.cc
# Opt level: O0

void __thiscall hwtest::pgraph::MthdD3D56TexFilter::emulate_mthd(MthdD3D56TexFilter *this)

{
  uint uVar1;
  bool bVar2;
  uint local_1c;
  uint local_18;
  int bias;
  uint32_t rval;
  bool is_mip;
  MthdD3D56TexFilter *this_local;
  
  bVar2 = true;
  if (((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x25) >> 0x3d != 5) {
    bVar2 = ((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x25) >> 0x3d == 6;
  }
  uVar1 = (this->super_SingleMthdTest).super_MthdTest.val;
  local_18 = uVar1 & 0xffff9e1e;
  if ((this->which & 1U) != 0) {
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[1] =
         (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[1] & 0xfffeffff |
         0x10000;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.d3d56_tex_filter[0] = local_18;
  }
  if ((((this->super_SingleMthdTest).super_MthdTest.cls == 0x54) && (bVar2)) &&
     (-1 < (long)((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x30))) {
    local_1c = (this->super_SingleMthdTest).super_MthdTest.val >> 0x10 & 0xff;
    if ((local_1c < 0x78) || (0x7f < local_1c)) {
      local_1c = local_1c + 8;
    }
    local_18 = uVar1 & 0xff009e1e | (local_1c & 0xff) << 0x10;
  }
  if ((this->which & 2U) != 0) {
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[1] =
         (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[1] & 0xff7fffff |
         0x800000;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.d3d56_tex_filter[1] = local_18;
  }
  return;
}

Assistant:

void emulate_mthd() override {
		bool is_mip = extr(val, 24, 3) == 5 || extr(val, 24, 3) == 6;
		uint32_t rval = val & 0xffff9e1e;
		if (which & 1) {
			insrt(exp.valid[1], 16, 1, 1);
			exp.d3d56_tex_filter[0] = rval;
		}
		if (cls == 0x54 && is_mip && !extr(val, 15, 1)) {
			int bias = extr(val, 16, 8);
			if (bias < 0x78 || bias >= 0x80)
				bias += 8;
			insrt(rval, 16, 8, bias);
		}
		if (which & 2) {
			insrt(exp.valid[1], 23, 1, 1);
			exp.d3d56_tex_filter[1] = rval;
		}
	}